

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2d.cpp
# Opt level: O1

void __thiscall Texture2D::Texture2D(Texture2D *this,string *filename,bool alpha,bool mps)

{
  undefined7 in_register_00000011;
  
  this->m_width = 0;
  this->m_height = 0;
  this->m_internal_format = 0x8058;
  this->m_image_format = (int)CONCAT71(in_register_00000011,alpha) + 0x1907;
  this->m_mipmaps = mps;
  this->m_filterMin = 0x2703;
  this->m_filterMag = 0x2601;
  (*glad_glGenTextures)(1,&this->m_id);
  (*glad_glBindTexture)(0xde1,this->m_id);
  load(this,filename,alpha);
  return;
}

Assistant:

Texture2D::Texture2D(const std::string& filename, bool alpha, bool mps)
    : m_width(0), 
      m_height(0), 
      m_internal_format(GL_RGBA8),
      m_image_format(alpha ? GL_RGBA : GL_RGB),
      m_mipmaps(mps),
      m_filterMin(GL_LINEAR_MIPMAP_LINEAR),
      m_filterMag(GL_LINEAR)
{
    DERR("Texture def CONSTR");

    init_texture();
    load(filename, alpha);
}